

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToDisk
          (GeneratorContextImpl *this,string *prefix)

{
  _Base_ptr p_Var1;
  int __errnum;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  ssize_t sVar8;
  ostream *poVar9;
  char *pcVar10;
  size_t sVar11;
  int error;
  long lVar12;
  void *__buf;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  _Base_ptr local_50;
  string *local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  if (this->had_error_ == false) {
    if ((prefix->_M_string_length == 0) ||
       (iVar5 = access((prefix->_M_dataplus)._M_p,0), iVar5 != -1)) {
      local_50 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_40 = &(this->files_)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_48 = prefix;
      if (local_50 == local_40) {
        return true;
      }
      do {
        p_Var1 = local_50 + 1;
        __buf = (void *)**(undefined8 **)(local_50 + 2);
        uVar13 = *(uint *)(*(undefined8 **)(local_50 + 2) + 1);
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SplitStringUsing((string *)p_Var1,"/",&local_68);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        pcVar2 = (local_48->_M_dataplus)._M_p;
        local_38 = p_Var1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar2,pcVar2 + local_48->_M_string_length);
        bVar4 = true;
        if ((long)local_68.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_68.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x20) {
          lVar12 = 8;
          uVar15 = 0;
          do {
            std::__cxx11::string::_M_append
                      ((char *)&local_88,
                       *(ulong *)((long)local_68.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar12 + -8));
            iVar5 = mkdir(local_88._M_dataplus._M_p,0x1ff);
            if ((iVar5 != 0) && (piVar7 = __errno_location(), *piVar7 != 0x11)) {
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,*(char **)(local_50 + 1),
                                  (long)local_50[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,": while trying to create directory ",0x23);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,local_88._M_dataplus._M_p,local_88._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
              pcVar10 = strerror(*piVar7);
              if (pcVar10 == (char *)0x0) {
                std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
              }
              else {
                sVar11 = strlen(pcVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              bVar4 = false;
              break;
            }
            std::__cxx11::string::push_back((char)&local_88);
            uVar15 = uVar15 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar15 < ((long)local_68.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_68.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        if (!bVar4) {
          return false;
        }
        std::operator+(&local_88,local_48,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                      );
        while (iVar5 = open(local_88._M_dataplus._M_p,0x241,0x1b6), iVar5 < 0) {
          piVar7 = __errno_location();
          iVar5 = *piVar7;
          if (iVar5 != 4) {
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_88._M_dataplus._M_p,
                                local_88._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
            pcVar10 = strerror(iVar5);
            std::operator<<(poVar9,pcVar10);
            goto LAB_0017e751;
          }
        }
        if (0 < (int)uVar13) {
          do {
            while( true ) {
              sVar8 = write(iVar5,__buf,(ulong)uVar13);
              uVar6 = (uint)sVar8;
              if (-1 < (int)uVar6) break;
              piVar7 = __errno_location();
              __errnum = *piVar7;
              if (__errnum != 4) {
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,local_88._M_dataplus._M_p,
                                    local_88._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,": write: ",9);
                pcVar10 = strerror(__errnum);
                if (pcVar10 == (char *)0x0) {
                  std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
                }
                else {
                  sVar11 = strlen(pcVar10);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
                }
                goto LAB_0017e751;
              }
            }
            if (uVar6 == 0) {
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_88._M_dataplus._M_p,
                                  local_88._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,": write() returned zero?",0x18);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              goto LAB_0017e751;
            }
            __buf = (void *)((long)__buf + (ulong)(uVar6 & 0x7fffffff));
            uVar14 = uVar13 - uVar6;
            bVar3 = (int)uVar6 <= (int)uVar13;
            uVar13 = uVar14;
          } while (uVar14 != 0 && bVar3);
        }
        iVar5 = close(iVar5);
        p_Var1 = local_50;
        if (iVar5 != 0) {
          piVar7 = __errno_location();
          iVar5 = *piVar7;
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_88._M_dataplus._M_p,
                              local_88._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,": close: ",9);
          pcVar10 = strerror(iVar5);
          std::operator<<(poVar9,pcVar10);
LAB_0017e751:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p == &local_88.field_2) {
            return false;
          }
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          return false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        local_50 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
        if (local_50 == local_40) {
          return bVar4;
        }
      } while( true );
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    piVar7 = __errno_location();
    pcVar10 = strerror(*piVar7);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToDisk(
    const string& prefix) {
  if (had_error_) {
    return false;
  }

  if (!VerifyDirectoryExists(prefix)) {
    return false;
  }

  for (map<string, string*>::const_iterator iter = files_.begin();
       iter != files_.end(); ++iter) {
    const string& relative_filename = iter->first;
    const char* data = iter->second->data();
    int size = iter->second->size();

    if (!TryCreateParentDirectory(prefix, relative_filename)) {
      return false;
    }
    string filename = prefix + relative_filename;

    // Create the output file.
    int file_descriptor;
    do {
      file_descriptor =
        open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
    } while (file_descriptor < 0 && errno == EINTR);

    if (file_descriptor < 0) {
      int error = errno;
      cerr << filename << ": " << strerror(error);
      return false;
    }

    // Write the file.
    while (size > 0) {
      int write_result;
      do {
        write_result = write(file_descriptor, data, size);
      } while (write_result < 0 && errno == EINTR);

      if (write_result <= 0) {
        // Write error.

        // FIXME(kenton):  According to the man page, if write() returns zero,
        //   there was no error; write() simply did not write anything.  It's
        //   unclear under what circumstances this might happen, but presumably
        //   errno won't be set in this case.  I am confused as to how such an
        //   event should be handled.  For now I'm treating it as an error,
        //   since retrying seems like it could lead to an infinite loop.  I
        //   suspect this never actually happens anyway.

        if (write_result < 0) {
          int error = errno;
          cerr << filename << ": write: " << strerror(error);
        } else {
          cerr << filename << ": write() returned zero?" << endl;
        }
        return false;
      }

      data += write_result;
      size -= write_result;
    }

    if (close(file_descriptor) != 0) {
      int error = errno;
      cerr << filename << ": close: " << strerror(error);
      return false;
    }
  }

  return true;
}